

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::getDHPublicKey
          (SoftHSM *this,DHPublicKey *publicKey,DHPrivateKey *privateKey,ByteString *pubParams)

{
  undefined8 uVar1;
  undefined8 in_RCX;
  long *in_RDX;
  long *in_RSI;
  undefined8 local_8;
  
  if (in_RSI == (long *)0x0) {
    local_8 = 7;
  }
  else if (in_RDX == (long *)0x0) {
    local_8 = 7;
  }
  else {
    uVar1 = (**(code **)(*in_RDX + 0x60))();
    (**(code **)(*in_RSI + 0x30))(in_RSI,uVar1);
    uVar1 = (**(code **)(*in_RDX + 0x68))();
    (**(code **)(*in_RSI + 0x38))(in_RSI,uVar1);
    (**(code **)(*in_RSI + 0x40))(in_RSI,in_RCX);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::getDHPublicKey(DHPublicKey* publicKey, DHPrivateKey* privateKey, ByteString& pubParams)
{
	if (publicKey == NULL) return CKR_ARGUMENTS_BAD;
	if (privateKey == NULL) return CKR_ARGUMENTS_BAD;

	// Copy Domain Parameters from Private Key
	publicKey->setP(privateKey->getP());
	publicKey->setG(privateKey->getG());

	// Set value
	publicKey->setY(pubParams);

	return CKR_OK;
}